

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_data_stream.h
# Opt level: O1

int __thiscall crnlib::cfile_stream::close(cfile_stream *this,int __fd)

{
  undefined1 *puVar1;
  byte bVar2;
  int iVar3;
  undefined8 in_RAX;
  
  bVar2 = (this->super_data_stream).field_0x1a;
  (this->super_data_stream).field_0x1a = bVar2 & 0xfd;
  if ((bVar2 & 1) != 0) {
    iVar3 = (int)CONCAT71((int7)((ulong)in_RAX >> 8),1);
    if (this->m_has_ownership == true) {
      iVar3 = fclose((FILE *)this->m_pFile);
      iVar3 = CONCAT31((int3)((uint)iVar3 >> 8),iVar3 != -1);
    }
    this->m_pFile = (FILE *)0x0;
    puVar1 = &(this->super_data_stream).field_0x1a;
    *puVar1 = *puVar1 & 0xfe;
    this->m_size = 0;
    this->m_ofs = 0;
    this->m_has_ownership = false;
    return iVar3;
  }
  return 0;
}

Assistant:

inline void clear_error() { m_error = false; }